

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O0

string * rcg::anon_unknown_1::storeImagePNG(string *name,Image *image,size_t yoffset,size_t height)

{
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  undefined8 *puVar4;
  void *pvVar5;
  __jmp_buf_tag *p_Var6;
  undefined8 uVar7;
  IOException *this;
  string *_msg;
  Image *in_RDX;
  string *in_RDI;
  size_t in_R8;
  string *in_stack_00000038;
  size_t k_3;
  png_infop info_3;
  png_structp png_3;
  FILE *out_3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> rgb_pixel;
  size_t i_1;
  size_t i;
  size_t k_2;
  size_t pstep;
  uint8_t *tmp;
  png_infop info_2;
  png_structp png_2;
  FILE *out_2;
  size_t k_1;
  png_infop info_1;
  png_structp png_1;
  FILE *out_1;
  size_t k;
  png_infop info;
  png_structp png;
  FILE *out;
  uint64_t format;
  size_t px;
  uchar *p;
  size_t real_height;
  size_t width;
  string *full_name;
  uchar *in_stack_fffffffffffffba8;
  uint uVar9;
  size_t sVar8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffbc4;
  string *in_stack_fffffffffffffbc8;
  IOException *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  uint8_t *in_stack_fffffffffffffbe0;
  allocator *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  uint64_t in_stack_fffffffffffffcb8;
  uint8_t *in_stack_fffffffffffffcc0;
  uint8_t *in_stack_fffffffffffffcc8;
  uint8_t *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffce0;
  allocator local_2f9;
  string local_2f8 [64];
  ulong local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined1 local_29a;
  undefined1 local_299;
  FILE *local_278;
  string local_270 [32];
  string local_250 [40];
  ulong local_228;
  ulong local_220;
  ulong local_218;
  long local_210;
  void *local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined1 local_1ea;
  undefined1 local_1e9;
  FILE *local_1c8;
  string local_1c0 [32];
  string local_1a0 [32];
  ulong local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_162;
  undefined1 local_161;
  FILE *local_140;
  string local_138 [32];
  string local_118 [32];
  ulong local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 local_da;
  undefined1 local_d9;
  FILE *local_b8;
  string local_a0 [32];
  string local_80 [39];
  undefined1 local_59;
  uint64_t local_58;
  size_t local_50;
  uint8_t *local_48;
  unsigned_long local_40;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  unsigned_long local_20;
  Image *local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_30 = Image::getWidth(in_RDX);
  local_38 = Image::getHeight(local_18);
  if (local_28 == 0) {
    local_28 = local_38;
  }
  puVar2 = std::min<unsigned_long>(&local_20,&local_38);
  local_20 = *puVar2;
  local_40 = local_38 - local_20;
  puVar2 = std::min<unsigned_long>(&local_28,&local_40);
  local_28 = *puVar2;
  local_48 = Image::getPixels((Image *)0x16c1df);
  local_50 = Image::getXPadding(local_18);
  local_58 = Image::getPixelFormat(local_18);
  local_59 = 0;
  std::__cxx11::string::string(in_RDI);
  if ((local_58 != 0x1080001) && (local_58 != 0x10800c6)) {
    if ((local_58 == 0x1100007) || (local_58 == 0x11000b8)) {
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      uVar9 = (uint)((ulong)in_stack_fffffffffffffba8 >> 0x20);
      ensureNewFileName(in_stack_00000038);
      std::__cxx11::string::operator=(in_RDI,local_118);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_140 = fopen(pcVar3,"wb");
      if (local_140 != (FILE *)0x0) {
        local_170 = png_create_write_struct("1.6.37",0,0);
        local_178 = png_create_info_struct(local_170);
        p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_170,longjmp,200);
        _setjmp(p_Var6);
        png_init_io(local_170,local_140);
        png_set_IHDR(local_170,local_178,local_30 & 0xffffffff,local_28 & 0xffffffff,0x10,0,
                     (ulong)uVar9 << 0x20,0,0);
        png_write_info(local_170,local_178);
        bVar1 = Image::isBigEndian(local_18);
        if (!bVar1) {
          png_set_swap(local_170);
        }
        local_48 = local_48 + (local_30 * 2 + local_50) * local_20;
        for (local_180 = 0; local_180 < local_28; local_180 = local_180 + 1) {
          png_write_row(local_170,local_48);
          local_48 = local_48 + local_30 * 2 + local_50;
        }
        png_write_end(local_170,local_178);
        fclose(local_140);
        png_destroy_write_struct(&local_170,&local_178);
        return in_RDI;
      }
      local_162 = 1;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pvVar5 = operator_new(0x28);
      local_161 = 1;
      std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      local_161 = 0;
      *puVar4 = pvVar5;
      local_162 = 0;
      __cxa_throw(puVar4,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
    if (((local_58 == 0x20c005a) || (local_58 == 0x2100032)) || (local_58 == 0x210003b)) {
      std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
      uVar9 = (uint)((ulong)in_stack_fffffffffffffba8 >> 0x20);
      ensureNewFileName(in_stack_00000038);
      std::__cxx11::string::operator=(in_RDI,local_1a0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_1c8 = fopen(pcVar3,"wb");
      if (local_1c8 != (FILE *)0x0) {
        local_1f8 = png_create_write_struct("1.6.37",0,0);
        local_200 = png_create_info_struct(local_1f8);
        p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_1f8,longjmp,200);
        _setjmp(p_Var6);
        png_init_io(local_1f8,local_1c8);
        png_set_IHDR(local_1f8,local_200,local_30 & 0xffffffff,local_28 & 0xffffffff,8,2,
                     (ulong)uVar9 << 0x20,0,0);
        png_write_info(local_1f8,local_200);
        local_208 = operator_new__(local_30 * 3);
        if (local_58 == 0x20c005a) {
          local_210 = (local_30 >> 2) * 6;
        }
        else {
          local_210 = (local_30 >> 2) * 8;
        }
        local_210 = local_210 + local_50;
        local_48 = local_48 + local_210 * local_20;
        for (local_218 = 0; local_218 < local_28; local_218 = local_218 + 1) {
          if (local_58 == 0x20c005a) {
            for (local_220 = 0; local_220 < local_30; local_220 = local_220 + 4) {
              convYCbCr411toQuadRGB
                        (in_stack_fffffffffffffbe0,(uint8_t *)in_stack_fffffffffffffbd8,
                         (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            }
          }
          else {
            for (local_228 = 0; local_228 < local_30; local_228 = local_228 + 4) {
              convYCbCr422toQuadRGB
                        ((uint8_t *)in_stack_fffffffffffffbd0,(uint8_t *)in_stack_fffffffffffffbc8,
                         in_stack_fffffffffffffbc4);
            }
          }
          png_write_row(local_1f8,local_208);
          local_48 = local_48 + local_210;
        }
        png_write_end(local_1f8,local_200);
        fclose(local_1c8);
        png_destroy_write_struct(&local_1f8,&local_200);
        return in_RDI;
      }
      local_1ea = 1;
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      pvVar5 = operator_new(0x28);
      local_1e9 = 1;
      std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      local_1e9 = 0;
      *puVar4 = pvVar5;
      local_1ea = 0;
      __cxa_throw(puVar4,&(anonymous_namespace)::IOException*::typeinfo,0);
    }
    if (local_58 != 0x81080001) {
      operator_new__(local_30 * local_28 * 3);
      std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
      unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffba8);
      sVar8 = local_30;
      if (local_58 == 0x2180014) {
        sVar8 = local_30 * 3;
      }
      local_48 = local_48 + (sVar8 + local_50) * local_20;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      sVar8 = local_50;
      bVar1 = convertImage(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                           in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                           in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                           in_stack_fffffffffffffce0);
      if (bVar1) {
        local_48 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                             ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
        std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
        ensureNewFileName(in_stack_00000038);
        std::__cxx11::string::operator=(in_RDI,local_250);
        std::__cxx11::string::~string(local_250);
        std::__cxx11::string::~string(local_270);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        local_278 = fopen(pcVar3,"wb");
        if (local_278 != (FILE *)0x0) {
          local_2a8 = png_create_write_struct("1.6.37",0,0);
          local_2b0 = png_create_info_struct(local_2a8);
          p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_2a8,longjmp,200);
          _setjmp(p_Var6);
          png_init_io(local_2a8,local_278);
          png_set_IHDR(local_2a8,local_2b0,local_30 & 0xffffffff,local_28 & 0xffffffff,8,2,
                       sVar8 & 0xffffffff00000000,0,0);
          png_write_info(local_2a8,local_2b0);
          for (local_2b8 = 0; local_2b8 < local_28; local_2b8 = local_2b8 + 1) {
            png_write_row(local_2a8,local_48);
            local_48 = local_48 + local_30 * 3;
          }
          png_write_end(local_2a8,local_2b0);
          fclose(local_278);
          png_destroy_write_struct(&local_2a8,&local_2b0);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                     CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
          return in_RDI;
        }
        local_29a = 1;
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pvVar5 = operator_new(0x28);
        local_299 = 1;
        std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        local_299 = 0;
        *puVar4 = pvVar5;
        local_29a = 0;
        __cxa_throw(puVar4,&(anonymous_namespace)::IOException*::typeinfo,0);
      }
      uVar7 = __cxa_allocate_exception(0x28);
      paVar10 = &local_2f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"storeImage(): Unsupported pixel format: ",paVar10);
      this = (IOException *)Image::getPixelFormat(local_18);
      _msg = (string *)GetPixelFormatName((PfncFormat)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                     (char *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      IOException::IOException(this,_msg);
      __cxa_throw(uVar7,&(anonymous_namespace)::IOException::typeinfo,IOException::~IOException);
    }
  }
  std::operator+(in_stack_fffffffffffffbd8,(char *)in_stack_fffffffffffffbd0);
  uVar9 = (uint)((ulong)in_stack_fffffffffffffba8 >> 0x20);
  ensureNewFileName(in_stack_00000038);
  std::__cxx11::string::operator=(in_RDI,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_b8 = fopen(pcVar3,"wb");
  if (local_b8 != (FILE *)0x0) {
    local_e8 = png_create_write_struct("1.6.37",0,0);
    local_f0 = png_create_info_struct(local_e8);
    p_Var6 = (__jmp_buf_tag *)png_set_longjmp_fn(local_e8,longjmp,200);
    _setjmp(p_Var6);
    png_init_io(local_e8,local_b8);
    png_set_IHDR(local_e8,local_f0,local_30 & 0xffffffff,local_28 & 0xffffffff,8,0,
                 (ulong)uVar9 << 0x20,0,0);
    png_write_info(local_e8,local_f0);
    local_48 = local_48 + (local_30 + local_50) * local_20;
    for (local_f8 = 0; local_f8 < local_28; local_f8 = local_f8 + 1) {
      png_write_row(local_e8,local_48);
      local_48 = local_48 + local_30 + local_50;
    }
    png_write_end(local_e8,local_f0);
    fclose(local_b8);
    png_destroy_write_struct(&local_e8,&local_f0);
    return in_RDI;
  }
  local_da = 1;
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pvVar5 = operator_new(0x28);
  local_d9 = 1;
  std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  IOException::IOException(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  local_d9 = 0;
  *puVar4 = pvVar5;
  local_da = 0;
  __cxa_throw(puVar4,&(anonymous_namespace)::IOException*::typeinfo,0);
}

Assistant:

std::string storeImagePNG(const std::string &name, const Image &image, size_t yoffset,
  size_t height)
{
  size_t width=image.getWidth();
  size_t real_height=image.getHeight();

  if (height == 0) height=real_height;

  yoffset=std::min(yoffset, real_height);
  height=std::min(height, real_height-yoffset);

  const unsigned char *p=static_cast<const unsigned char *>(image.getPixels());

  size_t px=image.getXPadding();

  uint64_t format=image.getPixelFormat();
  std::string full_name;

  switch (format)
  {
    case Mono8: // store 8 bit monochrome image
    case Confidence8:
    case Error8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        p+=(width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case Mono16:
    case Coord3D_C16: // store 16 bit monochrome image
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 16, PNG_COLOR_TYPE_GRAY,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        if (!image.isBigEndian())
        {
          png_set_swap(png);
        }

        p+=(2*width+px)*yoffset;
        for (size_t k=0; k<height; k++)
        {
          png_write_row(png, const_cast<png_bytep>(p));
          p+=2*width+px;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    case YCbCr411_8: // convert and store as color image
    case YCbCr422_8:
    case YUV422_8:
      {
        // open file and init

        full_name=ensureNewFileName(name+".png");
        FILE *out=fopen(full_name.c_str(), "wb");

        if (!out)
        {
          throw new IOException("Cannot store file: "+full_name);
        }

        png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
        png_infop info=png_create_info_struct(png);
        setjmp(png_jmpbuf(png));

        // write header

        png_init_io(png, out);
        png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
          PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
          PNG_FILTER_TYPE_DEFAULT);
        png_write_info(png, info);

        // write image body

        uint8_t *tmp=new uint8_t [3*width];

        size_t pstep;
        if (format == YCbCr411_8)
        {
          pstep=(width>>2)*6+px;
        }
        else
        {
          pstep=(width>>2)*8+px;
        }

        p+=pstep*yoffset;
        for (size_t k=0; k<height; k++)
        {
          if (format == YCbCr411_8)
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr411toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }
          else
          {
            for (size_t i=0; i<width; i+=4)
            {
              convYCbCr422toQuadRGB(tmp+3*i, p, static_cast<int>(i));
            }
          }

          png_write_row(png, tmp);
          p+=pstep;
        }

        // close file

        png_write_end(png, info);
        fclose(out);
        png_destroy_write_struct(&png, &info);
      }
      break;

    default: // try to store as color image
      {
        std::unique_ptr<uint8_t []> rgb_pixel(new uint8_t [3*width*height]);

        if (format == RGB8)
        {
          p+=(3*width+px)*yoffset;
        }
        else
        {
          p+=(width+px)*yoffset;
        }

        if (convertImage(rgb_pixel.get(), 0, p, format, width, height, px))
        {
          p=rgb_pixel.get();

          // open file and init

          full_name=ensureNewFileName(name+".png");
          FILE *out=fopen(full_name.c_str(), "wb");

          if (!out)
          {
            throw new IOException("Cannot store file: "+full_name);
          }

          png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);
          png_infop info=png_create_info_struct(png);
          setjmp(png_jmpbuf(png));

          // write header

          png_init_io(png, out);
          png_set_IHDR(png, info, width, height, 8, PNG_COLOR_TYPE_RGB,
            PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
            PNG_FILTER_TYPE_DEFAULT);
          png_write_info(png, info);

          // write image body

          for (size_t k=0; k<height; k++)
          {
            png_write_row(png, const_cast<png_bytep>(p));
            p+=3*width;
          }

          // close file

          png_write_end(png, info);
          fclose(out);
          png_destroy_write_struct(&png, &info);
        }
        else
        {
          throw IOException(std::string("storeImage(): Unsupported pixel format: ")+
            GetPixelFormatName(static_cast<PfncFormat>(image.getPixelFormat())));
        }
      }
      break;
  }

  return full_name;
}